

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall Player::killShip(Player *this,int shipId)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined2 *puVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  Ship *this_00;
  int j;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar50;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar51;
  int iVar52;
  int iVar55;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  
  this_00 = (Ship *)(&this->field_0x264 + (long)shipId * 0x20);
  iVar15 = Ship::getShipHeadi(this_00);
  iVar16 = Ship::getShipHeadj(this_00);
  iVar17 = Ship::getShipLength(this_00);
  bVar14 = Ship::getRotation(this_00);
  auVar13 = _DAT_001060c0;
  auVar12 = _DAT_001060b0;
  auVar11 = _DAT_001060a0;
  auVar10 = _DAT_00106090;
  auVar9 = _DAT_00106080;
  if (bVar14) {
    if (0 < iVar17) {
      lVar19 = (long)iVar16;
      lVar21 = (long)(iVar17 + iVar16);
      if ((long)(iVar17 + iVar16) < lVar19 + 1) {
        lVar21 = lVar19 + 1;
      }
      lVar22 = (lVar21 - lVar19) + -1;
      auVar23._8_4_ = (int)lVar22;
      auVar23._0_8_ = lVar22;
      auVar23._12_4_ = (int)((ulong)lVar22 >> 0x20);
      uVar20 = 0;
      auVar23 = auVar23 ^ _DAT_001060c0;
      do {
        auVar24._8_4_ = (int)uVar20;
        auVar24._0_8_ = uVar20;
        auVar24._12_4_ = (int)(uVar20 >> 0x20);
        auVar27 = (auVar24 | auVar12) ^ auVar13;
        iVar16 = auVar23._0_4_;
        iVar51 = -(uint)(iVar16 < auVar27._0_4_);
        iVar17 = auVar23._4_4_;
        auVar29._4_4_ = -(uint)(iVar17 < auVar27._4_4_);
        iVar50 = auVar23._8_4_;
        iVar55 = -(uint)(iVar50 < auVar27._8_4_);
        iVar52 = auVar23._12_4_;
        auVar29._12_4_ = -(uint)(iVar52 < auVar27._12_4_);
        auVar42._4_4_ = iVar51;
        auVar42._0_4_ = iVar51;
        auVar42._8_4_ = iVar55;
        auVar42._12_4_ = iVar55;
        auVar56 = pshuflw(in_XMM11,auVar42,0xe8);
        auVar28._4_4_ = -(uint)(auVar27._4_4_ == iVar17);
        auVar28._12_4_ = -(uint)(auVar27._12_4_ == iVar52);
        auVar28._0_4_ = auVar28._4_4_;
        auVar28._8_4_ = auVar28._12_4_;
        auVar61 = pshuflw(in_XMM12,auVar28,0xe8);
        auVar29._0_4_ = auVar29._4_4_;
        auVar29._8_4_ = auVar29._12_4_;
        auVar27 = pshuflw(auVar56,auVar29,0xe8);
        auVar57._8_4_ = 0xffffffff;
        auVar57._0_8_ = 0xffffffffffffffff;
        auVar57._12_4_ = 0xffffffff;
        auVar57 = (auVar27 | auVar61 & auVar56) ^ auVar57;
        auVar27 = packssdw(auVar57,auVar57);
        if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->playerArea[iVar15][lVar19 + uVar20] = 200;
        }
        auVar29 = auVar28 & auVar42 | auVar29;
        auVar27 = packssdw(auVar29,auVar29);
        auVar1._8_4_ = 0xffffffff;
        auVar1._0_8_ = 0xffffffffffffffff;
        auVar1._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar27 ^ auVar1,auVar27 ^ auVar1);
        if ((auVar27._0_4_ >> 0x10 & 1) != 0) {
          this->playerArea[iVar15][lVar19 + uVar20 + 1] = 200;
        }
        auVar27 = (auVar24 | auVar11) ^ auVar13;
        iVar51 = -(uint)(iVar16 < auVar27._0_4_);
        auVar53._4_4_ = -(uint)(iVar17 < auVar27._4_4_);
        iVar55 = -(uint)(iVar50 < auVar27._8_4_);
        auVar53._12_4_ = -(uint)(iVar52 < auVar27._12_4_);
        auVar30._4_4_ = iVar51;
        auVar30._0_4_ = iVar51;
        auVar30._8_4_ = iVar55;
        auVar30._12_4_ = iVar55;
        auVar43._4_4_ = -(uint)(auVar27._4_4_ == iVar17);
        auVar43._12_4_ = -(uint)(auVar27._12_4_ == iVar52);
        auVar43._0_4_ = auVar43._4_4_;
        auVar43._8_4_ = auVar43._12_4_;
        auVar53._0_4_ = auVar53._4_4_;
        auVar53._8_4_ = auVar53._12_4_;
        auVar27 = auVar43 & auVar30 | auVar53;
        auVar27 = packssdw(auVar27,auVar27);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar27 ^ auVar2,auVar27 ^ auVar2);
        if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          this->playerArea[iVar15][lVar19 + uVar20 + 2] = 200;
        }
        auVar31 = pshufhw(auVar30,auVar30,0x84);
        auVar44 = pshufhw(auVar43,auVar43,0x84);
        auVar32 = pshufhw(auVar31,auVar53,0x84);
        auVar33._8_4_ = 0xffffffff;
        auVar33._0_8_ = 0xffffffffffffffff;
        auVar33._12_4_ = 0xffffffff;
        auVar33 = (auVar32 | auVar44 & auVar31) ^ auVar33;
        auVar31 = packssdw(auVar33,auVar33);
        if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          this->playerArea[iVar15][lVar19 + uVar20 + 3] = 200;
        }
        auVar31 = (auVar24 | auVar10) ^ auVar13;
        iVar51 = -(uint)(iVar16 < auVar31._0_4_);
        auVar35._4_4_ = -(uint)(iVar17 < auVar31._4_4_);
        iVar55 = -(uint)(iVar50 < auVar31._8_4_);
        auVar35._12_4_ = -(uint)(iVar52 < auVar31._12_4_);
        auVar45._4_4_ = iVar51;
        auVar45._0_4_ = iVar51;
        auVar45._8_4_ = iVar55;
        auVar45._12_4_ = iVar55;
        auVar27 = pshuflw(auVar27,auVar45,0xe8);
        auVar34._4_4_ = -(uint)(auVar31._4_4_ == iVar17);
        auVar34._12_4_ = -(uint)(auVar31._12_4_ == iVar52);
        auVar34._0_4_ = auVar34._4_4_;
        auVar34._8_4_ = auVar34._12_4_;
        in_XMM12 = pshuflw(auVar61 & auVar56,auVar34,0xe8);
        in_XMM12 = in_XMM12 & auVar27;
        auVar35._0_4_ = auVar35._4_4_;
        auVar35._8_4_ = auVar35._12_4_;
        auVar27 = pshuflw(auVar27,auVar35,0xe8);
        auVar58._8_4_ = 0xffffffff;
        auVar58._0_8_ = 0xffffffffffffffff;
        auVar58._12_4_ = 0xffffffff;
        auVar58 = (auVar27 | in_XMM12) ^ auVar58;
        in_XMM11 = packssdw(auVar58,auVar58);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->playerArea[iVar15][lVar19 + uVar20 + 4] = 200;
        }
        auVar35 = auVar34 & auVar45 | auVar35;
        auVar27 = packssdw(auVar35,auVar35);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar27 ^ auVar3,auVar27 ^ auVar3);
        if ((auVar27 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          this->playerArea[iVar15][lVar19 + uVar20 + 5] = 200;
        }
        auVar27 = (auVar24 | auVar9) ^ auVar13;
        iVar16 = -(uint)(iVar16 < auVar27._0_4_);
        auVar46._4_4_ = -(uint)(iVar17 < auVar27._4_4_);
        iVar50 = -(uint)(iVar50 < auVar27._8_4_);
        auVar46._12_4_ = -(uint)(iVar52 < auVar27._12_4_);
        auVar36._4_4_ = iVar16;
        auVar36._0_4_ = iVar16;
        auVar36._8_4_ = iVar50;
        auVar36._12_4_ = iVar50;
        auVar25._4_4_ = -(uint)(auVar27._4_4_ == iVar17);
        auVar25._12_4_ = -(uint)(auVar27._12_4_ == iVar52);
        auVar25._0_4_ = auVar25._4_4_;
        auVar25._8_4_ = auVar25._12_4_;
        auVar46._0_4_ = auVar46._4_4_;
        auVar46._8_4_ = auVar46._12_4_;
        auVar27 = auVar25 & auVar36 | auVar46;
        auVar27 = packssdw(auVar27,auVar27);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar27 ^ auVar4,auVar27 ^ auVar4);
        if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          this->playerArea[iVar15][lVar19 + uVar20 + 6] = 200;
        }
        auVar56 = pshufhw(auVar36,auVar36,0x84);
        auVar27 = pshufhw(auVar25,auVar25,0x84);
        auVar61 = pshufhw(auVar56,auVar46,0x84);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar27 & auVar56,(auVar61 | auVar27 & auVar56) ^ auVar5);
        if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          this->playerArea[iVar15][lVar19 + uVar20 + 7] = 200;
        }
        uVar20 = uVar20 + 8;
      } while (((lVar21 - lVar19) + 7U & 0xfffffffffffffff8) != uVar20);
    }
  }
  else if (0 < iVar17) {
    lVar19 = (long)iVar16;
    lVar21 = (long)(iVar17 + iVar16);
    if ((long)(iVar17 + iVar16) < lVar19 + 1) {
      lVar21 = lVar19 + 1;
    }
    lVar22 = (lVar21 - lVar19) + -1;
    auVar27._8_4_ = (int)lVar22;
    auVar27._0_8_ = lVar22;
    auVar27._12_4_ = (int)((ulong)lVar22 >> 0x20);
    puVar18 = (undefined2 *)((long)this->enemyArea + lVar19 * 0x1a + -0x78);
    uVar20 = 0;
    auVar27 = auVar27 ^ _DAT_001060c0;
    do {
      auVar61._8_4_ = (int)uVar20;
      auVar61._0_8_ = uVar20;
      auVar61._12_4_ = (int)(uVar20 >> 0x20);
      auVar56 = (auVar61 | auVar12) ^ auVar13;
      iVar15 = auVar27._0_4_;
      iVar52 = -(uint)(iVar15 < auVar56._0_4_);
      iVar16 = auVar27._4_4_;
      auVar32._4_4_ = -(uint)(iVar16 < auVar56._4_4_);
      iVar17 = auVar27._8_4_;
      iVar51 = -(uint)(iVar17 < auVar56._8_4_);
      iVar50 = auVar27._12_4_;
      auVar32._12_4_ = -(uint)(iVar50 < auVar56._12_4_);
      auVar44._4_4_ = iVar52;
      auVar44._0_4_ = iVar52;
      auVar44._8_4_ = iVar51;
      auVar44._12_4_ = iVar51;
      auVar59 = pshuflw(in_XMM11,auVar44,0xe8);
      auVar31._4_4_ = -(uint)(auVar56._4_4_ == iVar16);
      auVar31._12_4_ = -(uint)(auVar56._12_4_ == iVar50);
      auVar31._0_4_ = auVar31._4_4_;
      auVar31._8_4_ = auVar31._12_4_;
      auVar62 = pshuflw(in_XMM12,auVar31,0xe8);
      auVar32._0_4_ = auVar32._4_4_;
      auVar32._8_4_ = auVar32._12_4_;
      auVar60 = pshuflw(auVar59,auVar32,0xe8);
      auVar56._8_4_ = 0xffffffff;
      auVar56._0_8_ = 0xffffffffffffffff;
      auVar56._12_4_ = 0xffffffff;
      auVar56 = (auVar60 | auVar62 & auVar59) ^ auVar56;
      auVar56 = packssdw(auVar56,auVar56);
      if ((auVar56 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar18[-0x54] = 200;
      }
      auVar32 = auVar31 & auVar44 | auVar32;
      auVar56 = packssdw(auVar32,auVar32);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar56 = packssdw(auVar56 ^ auVar60,auVar56 ^ auVar60);
      if ((auVar56._0_4_ >> 0x10 & 1) != 0) {
        puVar18[-0x48] = 200;
      }
      auVar56 = (auVar61 | auVar11) ^ auVar13;
      iVar52 = -(uint)(iVar15 < auVar56._0_4_);
      auVar54._4_4_ = -(uint)(iVar16 < auVar56._4_4_);
      iVar51 = -(uint)(iVar17 < auVar56._8_4_);
      auVar54._12_4_ = -(uint)(iVar50 < auVar56._12_4_);
      auVar37._4_4_ = iVar52;
      auVar37._0_4_ = iVar52;
      auVar37._8_4_ = iVar51;
      auVar37._12_4_ = iVar51;
      auVar47._4_4_ = -(uint)(auVar56._4_4_ == iVar16);
      auVar47._12_4_ = -(uint)(auVar56._12_4_ == iVar50);
      auVar47._0_4_ = auVar47._4_4_;
      auVar47._8_4_ = auVar47._12_4_;
      auVar54._0_4_ = auVar54._4_4_;
      auVar54._8_4_ = auVar54._12_4_;
      auVar56 = auVar47 & auVar37 | auVar54;
      auVar56 = packssdw(auVar56,auVar56);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar56 = packssdw(auVar56 ^ auVar6,auVar56 ^ auVar6);
      if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar18[-0x3c] = 200;
      }
      auVar31 = pshufhw(auVar37,auVar37,0x84);
      auVar44 = pshufhw(auVar47,auVar47,0x84);
      auVar32 = pshufhw(auVar31,auVar54,0x84);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar38 = (auVar32 | auVar44 & auVar31) ^ auVar38;
      auVar31 = packssdw(auVar38,auVar38);
      if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        puVar18[-0x30] = 200;
      }
      auVar31 = (auVar61 | auVar10) ^ auVar13;
      iVar52 = -(uint)(iVar15 < auVar31._0_4_);
      auVar40._4_4_ = -(uint)(iVar16 < auVar31._4_4_);
      iVar51 = -(uint)(iVar17 < auVar31._8_4_);
      auVar40._12_4_ = -(uint)(iVar50 < auVar31._12_4_);
      auVar48._4_4_ = iVar52;
      auVar48._0_4_ = iVar52;
      auVar48._8_4_ = iVar51;
      auVar48._12_4_ = iVar51;
      auVar56 = pshuflw(auVar56,auVar48,0xe8);
      auVar39._4_4_ = -(uint)(auVar31._4_4_ == iVar16);
      auVar39._12_4_ = -(uint)(auVar31._12_4_ == iVar50);
      auVar39._0_4_ = auVar39._4_4_;
      auVar39._8_4_ = auVar39._12_4_;
      in_XMM12 = pshuflw(auVar62 & auVar59,auVar39,0xe8);
      in_XMM12 = in_XMM12 & auVar56;
      auVar40._0_4_ = auVar40._4_4_;
      auVar40._8_4_ = auVar40._12_4_;
      auVar56 = pshuflw(auVar56,auVar40,0xe8);
      auVar59._8_4_ = 0xffffffff;
      auVar59._0_8_ = 0xffffffffffffffff;
      auVar59._12_4_ = 0xffffffff;
      auVar59 = (auVar56 | in_XMM12) ^ auVar59;
      in_XMM11 = packssdw(auVar59,auVar59);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar18[-0x24] = 200;
      }
      auVar40 = auVar39 & auVar48 | auVar40;
      auVar56 = packssdw(auVar40,auVar40);
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar56 = packssdw(auVar56 ^ auVar62,auVar56 ^ auVar62);
      if ((auVar56 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        puVar18[-0x18] = 200;
      }
      auVar56 = (auVar61 | auVar9) ^ auVar13;
      iVar15 = -(uint)(iVar15 < auVar56._0_4_);
      auVar49._4_4_ = -(uint)(iVar16 < auVar56._4_4_);
      iVar17 = -(uint)(iVar17 < auVar56._8_4_);
      auVar49._12_4_ = -(uint)(iVar50 < auVar56._12_4_);
      auVar41._4_4_ = iVar15;
      auVar41._0_4_ = iVar15;
      auVar41._8_4_ = iVar17;
      auVar41._12_4_ = iVar17;
      auVar26._4_4_ = -(uint)(auVar56._4_4_ == iVar16);
      auVar26._12_4_ = -(uint)(auVar56._12_4_ == iVar50);
      auVar26._0_4_ = auVar26._4_4_;
      auVar26._8_4_ = auVar26._12_4_;
      auVar49._0_4_ = auVar49._4_4_;
      auVar49._8_4_ = auVar49._12_4_;
      auVar56 = auVar26 & auVar41 | auVar49;
      auVar56 = packssdw(auVar56,auVar56);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar56 = packssdw(auVar56 ^ auVar7,auVar56 ^ auVar7);
      if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar18[-0xc] = 200;
      }
      auVar61 = pshufhw(auVar41,auVar41,0x84);
      auVar56 = pshufhw(auVar26,auVar26,0x84);
      auVar31 = pshufhw(auVar61,auVar49,0x84);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar56 = packssdw(auVar56 & auVar61,(auVar31 | auVar56 & auVar61) ^ auVar8);
      if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *puVar18 = 200;
      }
      uVar20 = uVar20 + 8;
      puVar18 = puVar18 + 0x60;
    } while (((lVar21 - lVar19) + 7U & 0xfffffffffffffff8) != uVar20);
  }
  return;
}

Assistant:

void Player::killShip(int shipId)
{
    int headX,headY,length;
    headX = playerFleet[shipId].getShipHeadi();
    headY = playerFleet[shipId].getShipHeadj();
    length = playerFleet[shipId].getShipLength();

    if(playerFleet[shipId].getRotation())
    {
        for(int j = headY; j <= headY+length-1; j++)
        {
            playerArea[headX][j] = Player::KILLED_CODE;

        }

    }
    else
    {
        for(int i = headY; i <= headY + length - 1; i++)
            playerArea[i][headY] = Player::KILLED_CODE;
    }


}